

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O0

iterator __thiscall
phmap::priv::
btree<phmap::priv::set_params<int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,_256,_false>_>
::internal_upper_bound<int>
          (btree<phmap::priv::set_params<int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,_256,_false>_>
           *this,int *key)

{
  undefined1 this_00 [8];
  undefined8 k;
  bool bVar1;
  node_type *n;
  key_compare *comp;
  undefined8 extraout_RDX;
  btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,_256,_false>_>,_int_&,_int_*>
  bVar2;
  iterator iVar3;
  undefined1 auStack_38 [8];
  iterator iter;
  int *key_local;
  btree<phmap::priv::set_params<int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,_256,_false>_>
  *this_local;
  
  iter._8_8_ = key;
  n = root(this);
  btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,_256,_false>_>,_int_&,_int_*>
  ::btree_iterator((btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,_256,_false>_>,_int_&,_int_*>
                    *)auStack_38,n,0);
  while( true ) {
    k = iter._8_8_;
    this_00 = auStack_38;
    comp = key_comp(this);
    iter.node._0_4_ =
         btree_node<phmap::priv::set_params<int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,_256,_false>_>
         ::upper_bound<int>((btree_node<phmap::priv::set_params<int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,_256,_false>_>
                             *)this_00,(int *)k,comp);
    bVar1 = btree_node<phmap::priv::set_params<int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,_256,_false>_>
            ::leaf((btree_node<phmap::priv::set_params<int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,_256,_false>_>
                    *)auStack_38);
    if (bVar1) break;
    auStack_38 = (undefined1  [8])
                 btree_node<phmap::priv::set_params<int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,_256,_false>_>
                 ::child((btree_node<phmap::priv::set_params<int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,_256,_false>_>
                          *)auStack_38,(long)(int)(uint)iter.node);
  }
  bVar2._8_8_ = extraout_RDX;
  bVar2.node = (btree_node<phmap::priv::set_params<int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,_256,_false>_>
                *)(ulong)(uint)iter.node;
  bVar2 = btree<phmap::priv::set_params<int,std::less<int>,phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,256,false>>
          ::
          internal_last<phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<int,std::less<int>,phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,256,false>>,int&,int*>>
                    ((btree<phmap::priv::set_params<int,std::less<int>,phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,256,false>>
                      *)auStack_38,bVar2);
  iVar3._12_4_ = 0;
  iVar3.node = (btree_node<phmap::priv::set_params<int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,_256,_false>_>
                *)SUB128(bVar2._0_12_,0);
  iVar3.position = SUB124(bVar2._0_12_,8);
  return iVar3;
}

Assistant:

auto btree<P>::internal_upper_bound(const K &key) const -> iterator {
        iterator iter(const_cast<node_type *>(root()), 0);
        for (;;) {
            iter.position = iter.node->upper_bound(key, key_comp());
            if (iter.node->leaf()) {
                break;
            }
            iter.node = iter.node->child(iter.position);
        }
        return internal_last(iter);
    }